

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void __thiscall Display::updateCursor(Display *this)

{
  bool bVar1;
  int x_00;
  int y_00;
  element_type *peVar2;
  Minefield local_98;
  tuple<int&,int&> local_30 [16];
  undefined1 local_20 [16];
  int y;
  int x;
  Display *this_local;
  
  _y = this;
  x_00 = Controller::getX(&this->controller);
  y_00 = Controller::getY(&this->controller);
  getConsolePosition((Display *)local_20,x_00,y_00);
  std::tie<int,int>((int *)local_30,(int *)(local_20 + 0xc));
  std::tuple<int&,int&>::operator=(local_30,(tuple<int,_int> *)local_20);
  peVar2 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar2->_vptr_IODevice[6])(peVar2,(ulong)(uint)local_20._12_4_,(ulong)(uint)local_20._8_4_);
  Controller::getMinefield(&local_98,&this->controller);
  bVar1 = Minefield::isGameEnded(&local_98);
  Minefield::~Minefield(&local_98);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->io);
    (*peVar2->_vptr_IODevice[7])(peVar2,0);
  }
  else {
    peVar2 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->io);
    (*peVar2->_vptr_IODevice[7])(peVar2,1);
  }
  return;
}

Assistant:

void Display::updateCursor() {
    int x, y;
    std::tie(x, y) = getConsolePosition(controller.getX(), controller.getY());
    io->moveCursor(x, y);

    if (controller.getMinefield().isGameEnded()) {
        io->setCursorVisibility(0);
    } else {
        io->setCursorVisibility(1);
    }
}